

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

void __thiscall spvtools::opt::SENode::DumpDot(SENode *this,ostream *out,bool recurse)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  int64_t iVar4;
  reference ppSVar5;
  hash<const_spvtools::opt::SENode_*> local_79;
  size_t local_78;
  size_t child_unique_id;
  SENode *child;
  const_iterator __end2;
  const_iterator __begin2;
  ChildContainerType *__range2;
  hash<const_spvtools::opt::SENode_*> local_29;
  size_t local_28;
  size_t unique_id;
  ostream *poStack_18;
  bool recurse_local;
  ostream *out_local;
  SENode *this_local;
  
  unique_id._7_1_ = recurse;
  poStack_18 = out;
  out_local = (ostream *)this;
  local_28 = std::hash<const_spvtools::opt::SENode_*>::operator()(&local_29,this);
  poVar3 = (ostream *)std::ostream::operator<<(poStack_18,local_28);
  poVar3 = std::operator<<(poVar3," [label=\"");
  AsString_abi_cxx11_((string *)&__range2,this);
  poVar3 = std::operator<<(poVar3,(string *)&__range2);
  std::operator<<(poVar3," ");
  std::__cxx11::string::~string((string *)&__range2);
  iVar2 = (**this->_vptr_SENode)();
  if (iVar2 == 0) {
    poVar3 = std::operator<<(poStack_18,"\nwith value: ");
    iVar2 = (*this->_vptr_SENode[5])();
    iVar4 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var,iVar2));
    std::ostream::operator<<(poVar3,iVar4);
  }
  std::operator<<(poStack_18,"\"]\n");
  __end2 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                     (&this->children_);
  child = (SENode *)
          std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                    (&this->children_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                *)&child);
    if (!bVar1) break;
    ppSVar5 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
              ::operator*(&__end2);
    child_unique_id = (size_t)*ppSVar5;
    local_78 = std::hash<const_spvtools::opt::SENode_*>::operator()
                         (&local_79,(SENode *)child_unique_id);
    poVar3 = (ostream *)std::ostream::operator<<(poStack_18,local_28);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_78);
    std::operator<<(poVar3," \n");
    if ((unique_id._7_1_ & 1) != 0) {
      DumpDot((SENode *)child_unique_id,poStack_18,true);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void SENode::DumpDot(std::ostream& out, bool recurse) const {
  size_t unique_id = std::hash<const SENode*>{}(this);
  out << unique_id << " [label=\"" << AsString() << " ";
  if (GetType() == SENode::Constant) {
    out << "\nwith value: " << this->AsSEConstantNode()->FoldToSingleValue();
  }
  out << "\"]\n";
  for (const SENode* child : children_) {
    size_t child_unique_id = std::hash<const SENode*>{}(child);
    out << unique_id << " -> " << child_unique_id << " \n";
    if (recurse) child->DumpDot(out, true);
  }
}